

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O0

void __thiscall
agge::tests::QuadraticBezierCurveTests::CoarseQBezier2ProducesLine(QuadraticBezierCurveTests *this)

{
  real_t *this_00;
  point pVar1;
  allocator local_271;
  string local_270 [32];
  LocationInfo local_250;
  point local_228;
  point local_218;
  point local_208;
  undefined1 local_1f8 [8];
  point reference2 [3];
  real_t local_1b8;
  int iStack_1b4;
  real_t local_1b0;
  point local_1a8;
  undefined1 local_198 [8];
  point points2 [3];
  undefined1 local_168 [8];
  qbezier b2;
  allocator local_131;
  string local_130 [32];
  LocationInfo local_110;
  point local_e8;
  point local_d8;
  point local_c8;
  undefined1 local_b8 [8];
  point reference1 [3];
  real_t local_88;
  int iStack_84;
  real_t local_80;
  real_t local_78;
  int iStack_74;
  real_t local_70;
  point local_68;
  undefined1 local_58 [8];
  point points1 [3];
  qbezier b1;
  QuadraticBezierCurveTests *this_local;
  
  this_00 = &points1[2].y;
  qbezier::qbezier((qbezier *)this_00,0.0,0.0,1.0,1.0,2.0,0.0,100.0);
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_68.command = pVar1.command;
  points1[0].x = (real_t)local_68.command;
  local_68._0_8_ = pVar1._0_8_;
  local_58._0_4_ = local_68.x;
  local_58._4_4_ = local_68.y;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_70 = (real_t)pVar1.command;
  points1[1].x = local_70;
  _local_78 = pVar1._0_8_;
  points1[0].y = local_78;
  points1[0].command = iStack_74;
  pVar1 = vertex<agge::qbezier>((qbezier *)this_00);
  local_80 = (real_t)pVar1.command;
  points1[2].x = local_80;
  _local_88 = pVar1._0_8_;
  points1[1].y = local_88;
  points1[1].command = iStack_84;
  pVar1 = moveto(0.0,0.0);
  local_c8.command = pVar1.command;
  local_c8._0_8_ = pVar1._0_8_;
  local_b8 = (undefined1  [8])local_c8._0_8_;
  reference1[0].x = (real_t)local_c8.command;
  pVar1 = lineto(2.0,0.0);
  local_d8.command = pVar1.command;
  reference1[1].x = (real_t)local_d8.command;
  local_d8._0_8_ = pVar1._0_8_;
  reference1[0].y = local_d8.x;
  reference1[0].command = (int)local_d8.y;
  local_d8 = pVar1;
  pVar1 = stop();
  local_e8.command = pVar1.command;
  reference1[2].x = (real_t)local_e8.command;
  local_e8._0_8_ = pVar1._0_8_;
  reference1[1].y = local_e8.x;
  reference1[1].command = (int)local_e8.y;
  local_e8 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_131);
  ut::LocationInfo::LocationInfo(&local_110,(string *)local_130,0x2e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])local_b8,(point (*) [3])local_58,&local_110);
  ut::LocationInfo::~LocationInfo(&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  qbezier::qbezier((qbezier *)local_168,10.0,11.0,1.0,1.0,13.0,17.0,100.0);
  pVar1 = vertex<agge::qbezier>((qbezier *)local_168);
  local_1a8.command = pVar1.command;
  points2[0].x = (real_t)local_1a8.command;
  local_1a8._0_8_ = pVar1._0_8_;
  local_198._0_4_ = local_1a8.x;
  local_198._4_4_ = local_1a8.y;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_168);
  local_1b0 = (real_t)pVar1.command;
  points2[1].x = local_1b0;
  _local_1b8 = pVar1._0_8_;
  points2[0].y = local_1b8;
  points2[0].command = iStack_1b4;
  pVar1 = vertex<agge::qbezier>((qbezier *)local_168);
  points2[2].x = (real_t)pVar1.command;
  points2[1]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(10.0,11.0);
  local_208.command = pVar1.command;
  local_208._0_8_ = pVar1._0_8_;
  local_1f8 = (undefined1  [8])local_208._0_8_;
  reference2[0].x = (real_t)local_208.command;
  pVar1 = lineto(13.0,17.0);
  local_218.command = pVar1.command;
  reference2[1].x = (real_t)local_218.command;
  local_218._0_8_ = pVar1._0_8_;
  reference2[0].y = local_218.x;
  reference2[0].command = (int)local_218.y;
  local_218 = pVar1;
  pVar1 = stop();
  local_228.command = pVar1.command;
  reference2[2].x = (real_t)local_228.command;
  local_228._0_8_ = pVar1._0_8_;
  reference2[1].y = local_228.x;
  reference2[1].command = (int)local_228.y;
  local_228 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_271);
  ut::LocationInfo::LocationInfo(&local_250,(string *)local_270,0x39);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])local_1f8,(point (*) [3])local_198,&local_250);
  ut::LocationInfo::~LocationInfo(&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  return;
}

Assistant:

test( CoarseQBezier2ProducesLine )
			{
				// INIT
				qbezier b1(0.0f, 0.0f, 1.0f, 1.0f, 2.0f, 0.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points1[] = { vertex(b1), vertex(b1), vertex(b1), };

				// ASSERT
				mocks::path::point reference1[] = { moveto(0.0f, 0.0f), lineto(2.0f, 0.0f), stop(), };

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(10.0f, 11.0f, 1.0f, 1.0f, 13.0f, 17.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points2[] = { vertex(b2), vertex(b2), vertex(b2), };

				// ASSERT
				mocks::path::point reference2[] = { moveto(10.0f, 11.0f), lineto(13.0f, 17.0f), stop(), };

				assert_equal(reference2, points2);
			}